

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O1

void __thiscall TaprootBuilder::Insert(TaprootBuilder *this,NodeInfo *node,int depth)

{
  byte bVar1;
  pointer poVar2;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_> local_88;
  NodeInfo local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0x80 < (uint)depth) {
    __assert_fail("depth >= 0 && (size_t)depth <= TAPROOT_CONTROL_MAX_NODE_COUNT",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                  ,0x13f,"void TaprootBuilder::Insert(TaprootBuilder::NodeInfo &&, int)");
  }
  if ((ulong)(depth + 1) <
      (ulong)((long)(this->m_branch).
                    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_branch).
                    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6)) {
    this->m_valid = false;
  }
  else if (this->m_valid == true) {
    uVar4 = (ulong)(uint)depth;
    poVar2 = (this->m_branch).
             super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar1 = 1;
    if (uVar4 < (ulong)((long)(this->m_branch).
                              super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)poVar2 >> 6)) {
      lVar3 = uVar4 << 6;
      do {
        if (*(char *)((long)&(poVar2->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                             _M_payload.
                             super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false> +
                     lVar3 + 0x38) != '\x01') break;
        Combine(&local_70,node,
                (NodeInfo *)
                ((long)&(poVar2->super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>).
                        _M_payload.
                        super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false> +
                lVar3));
        *(undefined8 *)((node->hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
             local_70.hash.super_base_blob<256U>.m_data._M_elems._16_8_;
        *(undefined8 *)((node->hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
             local_70.hash.super_base_blob<256U>.m_data._M_elems._24_8_;
        *(undefined8 *)(node->hash).super_base_blob<256U>.m_data._M_elems =
             local_70.hash.super_base_blob<256U>.m_data._M_elems._0_8_;
        *(undefined8 *)((node->hash).super_base_blob<256U>.m_data._M_elems + 8) =
             local_70.hash.super_base_blob<256U>.m_data._M_elems._8_8_;
        local_88.
        super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (node->leaves).
             super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_88.
        super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (node->leaves).
             super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_88.
        super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (node->leaves).
             super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (node->leaves).
        super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_70.leaves.
             super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (node->leaves).
        super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_70.leaves.
             super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (node->leaves).
        super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_70.leaves.
             super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_70.leaves.
        super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_70.leaves.
        super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_70.leaves.
        super__Vector_base<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::~vector
                  (&local_88);
        std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::~vector
                  (&local_70.leaves);
        poVar2 = (this->m_branch).
                 super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (this->m_branch).
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = poVar2 + -1;
        if (poVar2[-1].super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>._M_payload.
            super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
            super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_engaged == true) {
          poVar2[-1].super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>._M_payload.
          super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
          super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_engaged = false;
          std::vector<TaprootBuilder::LeafInfo,_std::allocator<TaprootBuilder::LeafInfo>_>::~vector
                    (&poVar2[-1].super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>.
                      _M_payload.
                      super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
                      super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_payload._M_value.
                      leaves);
        }
        if (lVar3 == 0) {
          this->m_valid = false;
        }
        bVar1 = this->m_valid;
        if ((bool)bVar1 == false) goto LAB_001b5f74;
        uVar4 = uVar4 - 1;
        poVar2 = (this->m_branch).
                 super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar3 = lVar3 + -0x40;
      } while (uVar4 < (ulong)((long)(this->m_branch).
                                     super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)poVar2 >> 6)
              );
    }
    if ((bVar1 & 1) != 0) {
      uVar4 = (ulong)(int)uVar4;
      if ((ulong)((long)(this->m_branch).
                        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_branch).
                        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 6) <= uVar4) {
        std::
        vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ::resize(&this->m_branch,uVar4 + 1);
      }
      poVar2 = (this->m_branch).
               super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(bool *)((long)&poVar2[uVar4].
                           super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>._M_payload.
                           super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false> +
                   0x38) == true) {
        __assert_fail("!m_branch[depth].has_value()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
                      ,0x152,"void TaprootBuilder::Insert(TaprootBuilder::NodeInfo &&, int)");
      }
      std::optional<TaprootBuilder::NodeInfo>::operator=(poVar2 + uVar4,node);
    }
  }
LAB_001b5f74:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TaprootBuilder::Insert(TaprootBuilder::NodeInfo&& node, int depth)
{
    assert(depth >= 0 && (size_t)depth <= TAPROOT_CONTROL_MAX_NODE_COUNT);
    /* We cannot insert a leaf at a lower depth while a deeper branch is unfinished. Doing
     * so would mean the Add() invocations do not correspond to a DFS traversal of a
     * binary tree. */
    if ((size_t)depth + 1 < m_branch.size()) {
        m_valid = false;
        return;
    }
    /* As long as an entry in the branch exists at the specified depth, combine it and propagate up.
     * The 'node' variable is overwritten here with the newly combined node. */
    while (m_valid && m_branch.size() > (size_t)depth && m_branch[depth].has_value()) {
        node = Combine(std::move(node), std::move(*m_branch[depth]));
        m_branch.pop_back();
        if (depth == 0) m_valid = false; /* Can't propagate further up than the root */
        --depth;
    }
    if (m_valid) {
        /* Make sure the branch is big enough to place the new node. */
        if (m_branch.size() <= (size_t)depth) m_branch.resize((size_t)depth + 1);
        assert(!m_branch[depth].has_value());
        m_branch[depth] = std::move(node);
    }
}